

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

size_type __thiscall
cmCTestMemCheckHandler::FindOrAddWarning(cmCTestMemCheckHandler *this,string *warning)

{
  ulong uVar1;
  __type _Var2;
  size_type sVar3;
  reference __lhs;
  value_type_conflict1 local_2c;
  ulong local_28;
  size_type i;
  string *warning_local;
  cmCTestMemCheckHandler *this_local;
  
  local_28 = 0;
  i = (size_type)warning;
  warning_local = (string *)this;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->ResultStrings);
    if (sVar3 <= uVar1) {
      local_2c = 0;
      std::vector<int,_std::allocator<int>_>::push_back(&this->GlobalResults,&local_2c);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->ResultStrings,(value_type *)i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->ResultStringsLong,(value_type *)i);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->ResultStrings);
      return sVar3 - 1;
    }
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->ResultStrings,local_28);
    _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)i);
    if (_Var2) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

std::vector<int>::size_type cmCTestMemCheckHandler::FindOrAddWarning(
  const std::string& warning)
{
  for (std::vector<std::string>::size_type i = 0;
       i < this->ResultStrings.size(); ++i) {
    if (this->ResultStrings[i] == warning) {
      return i;
    }
  }
  this->GlobalResults.push_back(0); // this must stay the same size
  this->ResultStrings.push_back(warning);
  this->ResultStringsLong.push_back(warning);
  return this->ResultStrings.size() - 1;
}